

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-c.cpp
# Opt level: O3

duckdb_string duckdb_value_string_internal(duckdb_result *result,idx_t col,idx_t row)

{
  char *__s;
  bool bVar1;
  duckdb_type dVar2;
  size_t sVar3;
  duckdb_string dVar4;
  
  bVar1 = CanFetchValue(result,col,row);
  if ((bVar1) && (dVar2 = duckdb_column_type(result,col), dVar2 == DUCKDB_TYPE_VARCHAR)) {
    __s = *(char **)((long)result->deprecated_columns[col].deprecated_data + row * 8);
    sVar3 = strlen(__s);
    dVar4.size = sVar3;
    dVar4.data = __s;
    return dVar4;
  }
  dVar4 = duckdb::FetchDefaultValue::Operation<duckdb_string>();
  return dVar4;
}

Assistant:

duckdb_string duckdb_value_string_internal(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<duckdb_string>();
	}
	if (duckdb_column_type(result, col) != DUCKDB_TYPE_VARCHAR) {
		return FetchDefaultValue::Operation<duckdb_string>();
	}
	// FIXME: this obviously does not work when there are null bytes in the string
	// we need to remove the deprecated C result materialization to get that to work correctly
	// since the deprecated C result materialization stores strings as null-terminated
	duckdb_string res;
	res.data = UnsafeFetch<char *>(result, col, row);
	res.size = strlen(res.data);
	return res;
}